

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O3

void deqp::gles3::Functional::evalTexture3DProjGradOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Texture3D *pTVar5;
  float fVar6;
  float fVar7;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  fVar1 = c->in[0].m_data[3];
  fVar2 = c->in[0].m_data[0];
  pTVar5 = c->textures[0].tex3D;
  fVar3 = c->in[0].m_data[1];
  fVar4 = c->in[0].m_data[2];
  fVar7 = glu::TextureTestUtil::computeLodFromDerivates
                    (LODMODE_EXACT,c->in[1].m_data[0] * (float)pTVar5->m_width,
                     c->in[1].m_data[1] * (float)pTVar5->m_height,
                     c->in[1].m_data[2] * (float)pTVar5->m_depth,
                     (float)pTVar5->m_width * c->in[2].m_data[0],
                     (float)pTVar5->m_height * c->in[2].m_data[1],
                     (float)pTVar5->m_depth * c->in[2].m_data[2]);
  pTVar5 = c->textures[0].tex3D;
  tcu::sampleLevelArray3DOffset
            ((ConstPixelBufferAccess *)&local_28,(int)(pTVar5->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar5->m_view).m_numLevels,fVar2 / fVar1,fVar3 / fVar1,
             fVar4 / fVar1,fVar7,(IVec3 *)c->textures);
  fVar1 = (p->scale).m_data[1];
  fVar2 = (p->scale).m_data[2];
  fVar3 = (p->scale).m_data[3];
  fVar4 = (p->bias).m_data[1];
  fVar7 = (p->bias).m_data[2];
  fVar6 = (p->bias).m_data[3];
  (c->color).m_data[0] = (p->scale).m_data[0] * local_28 + (p->bias).m_data[0];
  (c->color).m_data[1] = fVar1 * fStack_24 + fVar4;
  (c->color).m_data[2] = fVar2 * fStack_20 + fVar7;
  (c->color).m_data[3] = fVar3 * fStack_1c + fVar6;
  return;
}

Assistant:

static void		evalTexture3DProjGradOffset		(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3DOffset(c, c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), c.in[0].z()/c.in[0].w(), computeLodFromGrad3D(c), p.offset)*p.scale + p.bias; }